

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

string * __thiscall
google::protobuf::MessageLite::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,MessageLite *this)

{
  int iVar1;
  undefined4 extraout_var;
  ClassDataFull *pCVar2;
  StringifySink local_a0;
  AlphaNum local_80;
  Hex local_50;
  string_view local_40;
  ClassData *this_00;
  
  iVar1 = (*this->_vptr_MessageLite[4])(this);
  this_00 = (ClassData *)CONCAT44(extraout_var,iVar1);
  if (this_00 != (ClassData *)0x0) {
    if (this_00->is_lite == false) {
      pCVar2 = internal::ClassData::full(this_00);
      (*pCVar2->descriptor_methods->debug_string)(__return_storage_ptr__,this);
    }
    else {
      local_80.piece_ = absl::lts_20240722::NullSafeStringView("MessageLite at 0x");
      local_50.width = '\x01';
      local_50.fill = '0';
      local_a0.buffer_._M_dataplus._M_p = (pointer)&local_a0.buffer_.field_2;
      local_a0.buffer_.field_2._M_allocated_capacity = 0;
      local_a0.buffer_.field_2._8_8_ = 0;
      local_a0.buffer_._M_string_length = 0;
      local_50.value = (uint64_t)this;
      local_40 = absl::lts_20240722::strings_internal::
                 ExtractStringification<absl::lts_20240722::Hex>(&local_a0,&local_50);
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    return __return_storage_ptr__;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/message_lite.cc"
             ,0x86,0xf,"data != nullptr");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_80);
}

Assistant:

std::string MessageLite::DebugString() const {
  auto* data = GetClassData();
  ABSL_DCHECK(data != nullptr);
  if (!data->is_lite) {
    return data->full().descriptor_methods->debug_string(*this);
  }

  return absl::StrCat("MessageLite at 0x", absl::Hex(this));
}